

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::XmlReporter::benchmarkEnded
          (XmlReporter *this,
          BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
          *benchmarkStats)

{
  XmlWriter *this_00;
  XmlWriter *this_01;
  XmlWriter *this_02;
  long in_RSI;
  undefined8 in_stack_fffffffffffffbf0;
  XmlFormatting XVar1;
  string *in_stack_fffffffffffffbf8;
  XmlWriter *in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc18;
  XmlFormatting fmt;
  XmlWriter *in_stack_fffffffffffffc20;
  char *in_stack_fffffffffffffc28;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  double *in_stack_fffffffffffffc50;
  allocator<char> *attribute;
  string *in_stack_fffffffffffffc58;
  string *name;
  XmlWriter *in_stack_fffffffffffffc60;
  allocator<char> local_2c9;
  string local_2c8 [39];
  allocator<char> local_2a1;
  string local_2a0 [39];
  allocator<char> local_279;
  string local_278 [39];
  allocator<char> local_251;
  string local_250 [39];
  allocator<char> local_229;
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [39];
  undefined1 local_1d9 [33];
  rep local_1b8;
  allocator<char> local_1a9;
  string local_1a8 [32];
  rep local_188;
  allocator<char> local_179;
  string local_178 [32];
  rep local_158;
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [32];
  rep local_d8;
  allocator<char> local_c9;
  string local_c8 [32];
  rep local_a8;
  allocator<char> local_99;
  string local_98 [32];
  rep local_78;
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  long local_10;
  
  fmt = (XmlFormatting)((ulong)in_stack_fffffffffffffc18 >> 0x20);
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             (allocator<char> *)in_stack_fffffffffffffc20);
  operator|(Newline,Indent);
  XVar1 = (XmlFormatting)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
  XmlWriter::startElement(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,XVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             (allocator<char> *)in_stack_fffffffffffffc20);
  local_78 = clara::std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                       ((duration<double,_std::ratio<1L,_1000000000L>_> *)(local_10 + 0x60));
  XmlWriter::writeAttribute<double>
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             (allocator<char> *)in_stack_fffffffffffffc20);
  local_a8 = clara::std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                       ((duration<double,_std::ratio<1L,_1000000000L>_> *)(local_10 + 0x68));
  XmlWriter::writeAttribute<double>
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             (allocator<char> *)in_stack_fffffffffffffc20);
  local_d8 = clara::std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                       ((duration<double,_std::ratio<1L,_1000000000L>_> *)(local_10 + 0x70));
  XmlWriter::writeAttribute<double>
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             (allocator<char> *)in_stack_fffffffffffffc20);
  XmlWriter::writeAttribute<double>
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  operator|(Newline,Indent);
  XmlWriter::endElement(in_stack_fffffffffffffc20,fmt);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             (allocator<char> *)in_stack_fffffffffffffc20);
  operator|(Newline,Indent);
  XmlWriter::startElement(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,XVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             (allocator<char> *)in_stack_fffffffffffffc20);
  local_158 = clara::std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                        ((duration<double,_std::ratio<1L,_1000000000L>_> *)(local_10 + 0x80));
  XmlWriter::writeAttribute<double>
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             (allocator<char> *)in_stack_fffffffffffffc20);
  local_188 = clara::std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                        ((duration<double,_std::ratio<1L,_1000000000L>_> *)(local_10 + 0x88));
  XmlWriter::writeAttribute<double>
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             (allocator<char> *)in_stack_fffffffffffffc20);
  local_1b8 = clara::std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                        ((duration<double,_std::ratio<1L,_1000000000L>_> *)(local_10 + 0x90));
  this_00 = XmlWriter::writeAttribute<double>
                      (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50
                      );
  name = (string *)local_1d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             (allocator<char> *)in_stack_fffffffffffffc20);
  XmlWriter::writeAttribute<double>(this_00,name,in_stack_fffffffffffffc50);
  std::__cxx11::string::~string((string *)(local_1d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1d9);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  operator|(Newline,Indent);
  XmlWriter::endElement(in_stack_fffffffffffffc20,fmt);
  attribute = &local_201;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             (allocator<char> *)in_stack_fffffffffffffc20);
  operator|(Newline,Indent);
  XmlWriter::startElement(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,XVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             (allocator<char> *)in_stack_fffffffffffffc20);
  this_01 = XmlWriter::writeAttribute<double>(this_00,name,(double *)attribute);
  __s = &local_251;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
             (char *)__s,(allocator<char> *)in_stack_fffffffffffffc20);
  this_02 = XmlWriter::writeAttribute<int>(this_00,name,(int *)attribute);
  XVar1 = (XmlFormatting)((ulong)&local_279 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
             (char *)__s,(allocator<char> *)this_02);
  XmlWriter::writeAttribute<int>(this_00,name,(int *)attribute);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
             (char *)__s,(allocator<char> *)this_02);
  XmlWriter::writeAttribute<int>(this_00,name,(int *)attribute);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
             (char *)__s,(allocator<char> *)this_02);
  XmlWriter::writeAttribute<int>(this_00,name,(int *)attribute);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_279);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  operator|(Newline,Indent);
  XmlWriter::endElement(this_02,XVar1);
  operator|(Newline,Indent);
  XmlWriter::endElement(this_02,XVar1);
  return;
}

Assistant:

void XmlReporter::benchmarkEnded(BenchmarkStats<> const& benchmarkStats) {
        m_xml.startElement("mean")
            .writeAttribute("value", benchmarkStats.mean.point.count())
            .writeAttribute("lowerBound", benchmarkStats.mean.lower_bound.count())
            .writeAttribute("upperBound", benchmarkStats.mean.upper_bound.count())
            .writeAttribute("ci", benchmarkStats.mean.confidence_interval);
        m_xml.endElement();
        m_xml.startElement("standardDeviation")
            .writeAttribute("value", benchmarkStats.standardDeviation.point.count())
            .writeAttribute("lowerBound", benchmarkStats.standardDeviation.lower_bound.count())
            .writeAttribute("upperBound", benchmarkStats.standardDeviation.upper_bound.count())
            .writeAttribute("ci", benchmarkStats.standardDeviation.confidence_interval);
        m_xml.endElement();
        m_xml.startElement("outliers")
            .writeAttribute("variance", benchmarkStats.outlierVariance)
            .writeAttribute("lowMild", benchmarkStats.outliers.low_mild)
            .writeAttribute("lowSevere", benchmarkStats.outliers.low_severe)
            .writeAttribute("highMild", benchmarkStats.outliers.high_mild)
            .writeAttribute("highSevere", benchmarkStats.outliers.high_severe);
        m_xml.endElement();
        m_xml.endElement();
    }